

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cc
# Opt level: O2

IntegralConvertResult __thiscall
absl::str_format_internal::FormatConvertImpl
          (str_format_internal *this,char *v,FormatConversionSpecImpl conv,FormatSinkImpl *sink)

{
  bool bVar1;
  char *pcVar2;
  FormatSinkImpl *sink_00;
  size_t sVar3;
  string_view v_00;
  FormatConversionSpecImpl conv_00;
  FormatConversionSpecImpl conv_01;
  
  sink_00 = (FormatSinkImpl *)CONCAT44((int)((ulong)register0x00000008 >> 0x20),conv.precision_);
  conv_01.precision_ = conv._0_4_;
  if ((char)v == '\x11') {
    conv_01._0_8_ = v;
    FormatConvertImpl((VoidPtr)this,conv_01,sink_00);
    bVar1 = true;
  }
  else {
    if (this == (str_format_internal *)0x0) {
      sVar3 = 0;
    }
    else if ((int)conv_01.precision_ < 0) {
      sVar3 = strlen((char *)this);
    }
    else {
      pcVar2 = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                         (this,this + conv_01.precision_);
      sVar3 = (long)pcVar2 - (long)this;
    }
    v_00._M_str = (char *)this;
    v_00._M_len = sVar3;
    conv_00.precision_ = conv_01.precision_;
    conv_00._0_8_ = v;
    bVar1 = anon_unknown_53::ConvertStringArg(v_00,conv_00,sink_00);
  }
  return (IntegralConvertResult)bVar1;
}

Assistant:

StringPtrConvertResult FormatConvertImpl(const char* v,
                                         const FormatConversionSpecImpl conv,
                                         FormatSinkImpl* sink) {
  if (conv.conversion_char() == FormatConversionCharInternal::p)
    return {FormatConvertImpl(VoidPtr(v), conv, sink).value};
  size_t len;
  if (v == nullptr) {
    len = 0;
  } else if (conv.precision() < 0) {
    len = std::strlen(v);
  } else {
    // If precision is set, we look for the NUL-terminator on the valid range.
    len = static_cast<size_t>(std::find(v, v + conv.precision(), '\0') - v);
  }
  return {ConvertStringArg(string_view(v, len), conv, sink)};
}